

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmime_string.c
# Opt level: O1

char * cmime_string_strip(char *s)

{
  size_t sVar1;
  ushort **ppuVar2;
  char *pcVar3;
  char *pcVar4;
  char cVar5;
  
  if (s == (char *)0x0) {
    __assert_fail("s",
                  "/workspace/llm4binary/github/license_c_cmakelists/spmfilter[P]libcmime/src/cmime_string.c"
                  ,0x46,"char *cmime_string_strip(char *)");
  }
  sVar1 = strlen(s);
  cVar5 = *s;
  pcVar3 = s;
  if (cVar5 != '\0') {
    ppuVar2 = __ctype_b_loc();
    do {
      if ((*(byte *)((long)*ppuVar2 + (long)cVar5 * 2 + 1) & 0x20) == 0) break;
      cVar5 = pcVar3[1];
      pcVar3 = pcVar3 + 1;
    } while (cVar5 != '\0');
  }
  pcVar4 = s + (sVar1 - 1);
  if (pcVar3 < pcVar4) {
    ppuVar2 = __ctype_b_loc();
    do {
      if ((*(byte *)((long)*ppuVar2 + (long)*pcVar4 * 2 + 1) & 0x20) == 0) {
        return pcVar3;
      }
      *pcVar4 = '\0';
      pcVar4 = pcVar4 + -1;
    } while (pcVar3 < pcVar4);
  }
  return pcVar3;
}

Assistant:

char *cmime_string_strip(char *s) {
    assert(s);

    char * e = s + strlen(s) - 1;
    while(*s && isspace(*s)) s++;
    while(e > s && isspace(*e)) *e-- = '\0';

    return(s);
}